

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TablePrinter.hpp
# Opt level: O0

TablePrinter * __thiscall trl::TablePrinter::operator<<(TablePrinter *this,int input)

{
  int iVar1;
  ostream *poVar2;
  _Setw _Var3;
  int iVar4;
  reference pvVar5;
  int input_local;
  TablePrinter *this_local;
  
  if (this->m_columnIndex == 0) {
    std::operator<<(this->m_outStream,"|");
  }
  if ((this->m_flushLeft & 1U) == 0) {
    std::ostream::operator<<(this->m_outStream,std::right);
  }
  else {
    std::ostream::operator<<(this->m_outStream,std::left);
  }
  poVar2 = this->m_outStream;
  pvVar5 = std::vector<int,_std::allocator<int>_>::at
                     (&this->m_columnWidths,(long)this->m_columnIndex);
  _Var3 = std::setw(*pvVar5);
  std::operator<<(poVar2,_Var3);
  std::ostream::operator<<(this->m_outStream,input);
  iVar1 = this->m_columnIndex;
  iVar4 = GetColumnCount(this);
  if (iVar1 == iVar4 + -1) {
    std::operator<<(this->m_outStream,"|\n");
    this->m_rowIndex = this->m_rowIndex + 1;
    this->m_columnIndex = 0;
  }
  else {
    std::operator<<(this->m_outStream,(string *)&this->m_columnSeparator);
    this->m_columnIndex = this->m_columnIndex + 1;
  }
  return this;
}

Assistant:

TablePrinter& operator<<(T input) {

            if constexpr(std::is_floating_point<T>::value) {
                OutputDecimalNumber<T>(input);
            }
            else {

                if (m_columnIndex == 0)
                    m_outStream << "|";

                if (m_flushLeft)
                    m_outStream << std::left;
                else
                    m_outStream << std::right;

                // Leave 3 extra space: One for negative sign, one for zero, one for decimal
                m_outStream << std::setw(m_columnWidths.at(m_columnIndex));
                m_outStream << input;

                if (m_columnIndex == GetColumnCount() - 1) {
                    m_outStream << "|\n";
                    m_rowIndex    = m_rowIndex + 1;
                    m_columnIndex = 0;
                }
                else {
                    m_outStream << m_columnSeparator;
                    ++m_columnIndex;
                }
            }
            return *this;
        }